

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O0

void __thiscall flow::IRHandler::moveBefore(IRHandler *this,BasicBlock *moveable,BasicBlock *before)

{
  IRHandler *pIVar1;
  iterator __first;
  iterator __last;
  reference puVar2;
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  *this_00;
  bool bVar3;
  const_iterator local_90 [3];
  BasicBlock **local_78;
  _List_node_base *local_70;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
  local_68;
  _List_node_base *local_60;
  _List_node_base *local_58;
  const_iterator local_50;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> local_48;
  unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> m;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
  local_28;
  _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_> i;
  BasicBlock *before_local;
  BasicBlock *moveable_local;
  IRHandler *this_local;
  
  i._M_node = (_List_node_base *)before;
  before_local = moveable;
  moveable_local = (BasicBlock *)this;
  pIVar1 = BasicBlock::getHandler(moveable);
  bVar3 = false;
  if (pIVar1 == this) {
    pIVar1 = BasicBlock::getHandler((BasicBlock *)i._M_node);
    bVar3 = pIVar1 == this;
  }
  if (!bVar3) {
    __assert_fail("moveable->getHandler() == this && before->getHandler() == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRHandler.cc"
                  ,0x68,"void flow::IRHandler::moveBefore(const BasicBlock *, const BasicBlock *)");
  }
  this_00 = &this->blocks_;
  __first = std::__cxx11::
            list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
            ::begin(this_00);
  __last = std::__cxx11::
           list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ::end(this_00);
  m._M_t.super___uniq_ptr_impl<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>._M_t.
  super__Tuple_impl<0UL,_flow::BasicBlock_*,_std::default_delete<flow::BasicBlock>_>.
  super__Head_base<0UL,_flow::BasicBlock_*,_false>._M_head_impl =
       (__uniq_ptr_data<flow::BasicBlock,_std::default_delete<flow::BasicBlock>,_true,_true>)
       &before_local;
  local_28 = std::
             find_if<std::_List_iterator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>,flow::IRHandler::moveBefore(flow::BasicBlock_const*,flow::BasicBlock_const*)::__0>
                       (__first._M_node,__last._M_node,
                        (anon_class_8_1_e1b8a629_for__M_pred)
                        m._M_t.
                        super___uniq_ptr_impl<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_flow::BasicBlock_*,_std::default_delete<flow::BasicBlock>_>
                        .super__Head_base<0UL,_flow::BasicBlock_*,_false>._M_head_impl);
  puVar2 = std::
           _List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
           ::operator*(&local_28);
  std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::unique_ptr
            (&local_48,puVar2);
  std::
  _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>::
  _List_const_iterator(&local_50,&local_28);
  local_58 = (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
             ::erase(this_00,local_50);
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
       ::begin(this_00);
  local_70 = (_List_node_base *)
             std::__cxx11::
             list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
             ::end(this_00);
  local_78 = (BasicBlock **)&i;
  local_60 = (_List_node_base *)
             std::
             find_if<std::_List_iterator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>,flow::IRHandler::moveBefore(flow::BasicBlock_const*,flow::BasicBlock_const*)::__1>
                       (local_68,(_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
                                  )local_70,(anon_class_8_1_4e1e30bd_for__M_pred)local_78);
  local_28 = (_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>
              )local_60;
  std::_List_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>::
  operator++(&local_28);
  std::
  _List_const_iterator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>::
  _List_const_iterator(local_90,&local_28);
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
  ::insert(&this->blocks_,local_90[0],&local_48);
  std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

void IRHandler::moveBefore(const BasicBlock* moveable, const BasicBlock* before) {
  assert(moveable->getHandler() == this && before->getHandler() == this);

  auto i = std::find_if(blocks_.begin(), blocks_.end(),
                        [&](const auto& obj) { return obj.get() == moveable; });
  std::unique_ptr<BasicBlock> m = std::move(*i);
  blocks_.erase(i);

  i = std::find_if(blocks_.begin(), blocks_.end(),
                   [&](const auto& obj) { return obj.get() == before; });
  ++i;
  blocks_.insert(i, std::move(m));
}